

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTestShared.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::NegativeTestShared::NegativeTestContext::NegativeTestContext
          (NegativeTestContext *this,ErrorCase *host,RenderContext *renderCtx,ContextInfo *ctxInfo,
          TestLog *log,ResultCollector *results,bool enableLogging_)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),log);
  this->m_host = host;
  this->m_renderCtx = renderCtx;
  this->m_ctxInfo = ctxInfo;
  this->m_results = results;
  this->m_openSections = 0;
  (this->super_CallLogWrapper).m_enableLog = enableLogging_;
  return;
}

Assistant:

NegativeTestContext::NegativeTestContext (ErrorCase&				host,
										  glu::RenderContext&		renderCtx,
										  const glu::ContextInfo&	ctxInfo,
										  tcu::TestLog&				log,
										  tcu::ResultCollector&		results,
										  bool						enableLogging_)
	: glu::CallLogWrapper	(renderCtx.getFunctions(), log)
	, m_host				(host)
	, m_renderCtx			(renderCtx)
	, m_ctxInfo				(ctxInfo)
	, m_results				(results)
	, m_openSections		(0)
{
	enableLogging(enableLogging_);
}